

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O3

void aec_get_rsi_msb_16(aec_stream *strm)

{
  ushort uVar1;
  uchar *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  ulong uVar5;
  
  puVar2 = strm->next_in;
  uVar4 = strm->block_size * strm->rsi;
  if (0 < (int)uVar4) {
    puVar3 = strm->state->data_raw;
    uVar5 = 0;
    do {
      uVar1 = *(ushort *)(puVar2 + uVar5 * 2);
      puVar3[uVar5] = (uint)(ushort)(uVar1 << 8 | uVar1 >> 8);
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  strm->next_in = puVar2 + (int)(uVar4 * 2);
  strm->avail_in = strm->avail_in - (long)(int)(uVar4 * 2);
  return;
}

Assistant:

void aec_get_rsi_msb_16(struct aec_stream *strm)
{
    uint32_t *restrict out = strm->state->data_raw;
    const unsigned char *restrict in = strm->next_in;
    int rsi = strm->rsi * strm->block_size;

    for (int i = 0; i < rsi; i++)
        out[i] = ((uint32_t)in[2 * i] << 8) | (uint32_t)in[2 * i + 1];

    strm->next_in += 2 * rsi;
    strm->avail_in -= 2 * rsi;
}